

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O3

bool __thiscall
MeCab::DictionaryRewriter::rewrite2
          (DictionaryRewriter *this,string *feature,string *ufeature,string *lfeature,
          string *rfeature)

{
  bool bVar1;
  iterator iVar2;
  FeatureSet f;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>
  local_b0;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>_>
          ::find(&(this->cache_)._M_t,feature);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->cache_)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = rewrite(this,feature,ufeature,lfeature,rfeature);
    if (!bVar1) {
      return false;
    }
    local_110._0_8_ = local_110 + 0x10;
    local_110._8_8_ = 0;
    local_110[0x10] = '\0';
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_assign((string *)local_110);
    std::__cxx11::string::_M_assign((string *)&local_f0);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>
    ::pair<MeCab::FeatureSet_&,_true>(&local_b0,feature,(FeatureSet *)local_110);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::FeatureSet>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::FeatureSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::FeatureSet>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,MeCab::FeatureSet>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::FeatureSet>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::FeatureSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::FeatureSet>>>
                *)&this->cache_,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.rfeature._M_dataplus._M_p != &local_b0.second.rfeature.field_2) {
      operator_delete(local_b0.second.rfeature._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.lfeature._M_dataplus._M_p != &local_b0.second.lfeature.field_2) {
      operator_delete(local_b0.second.lfeature._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.ufeature._M_dataplus._M_p != &local_b0.second.ufeature.field_2) {
      operator_delete(local_b0.second.ufeature._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p);
    }
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)ufeature);
    std::__cxx11::string::_M_assign((string *)lfeature);
    std::__cxx11::string::_M_assign((string *)rfeature);
  }
  return true;
}

Assistant:

bool DictionaryRewriter::rewrite2(const std::string &feature,
                                  std::string *ufeature,
                                  std::string *lfeature,
                                  std::string *rfeature) {
  std::map<std::string, FeatureSet>::const_iterator it = cache_.find(feature);
  if (it == cache_.end()) {
    if (!rewrite(feature, ufeature, lfeature, rfeature)) return false;
    FeatureSet f;
    f.ufeature = *ufeature;
    f.lfeature = *lfeature;
    f.rfeature = *rfeature;
    cache_.insert(std::pair<std::string, FeatureSet>(feature, f));
  } else {
    *ufeature = it->second.ufeature;
    *lfeature = it->second.lfeature;
    *rfeature = it->second.rfeature;
  }

  return true;
}